

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::ReplaceStringInPlace
               (string *subject,char *search,int searchSize,char *replace,int replaceSize,
               size_t *firstReplacementIndex)

{
  bool bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined4 in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined4 in_R8D;
  size_type *in_R9;
  size_t pos;
  bool changed;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = false;
  while (sVar2 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           (in_RCX,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                            (size_type)in_R9), sVar2 != 0xffffffffffffffff) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(size_type)in_RCX,
               (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
    if (bVar1 == false) {
      bVar1 = true;
      *in_R9 = sVar2;
    }
  }
  return bVar1;
}

Assistant:

static bool ReplaceStringInPlace(
    std::string& subject,
    const char* search,
    int searchSize,
    const char* replace,
    int replaceSize,
    std::size_t& firstReplacementIndex)
{
    bool changed{false};
    std::size_t pos{0};
    while ((pos = subject.find(search, pos)) != std::string::npos) {
        subject.replace(pos, searchSize, replace);
        if (!changed) {
            changed = true;
            firstReplacementIndex = pos;
        }
        pos += replaceSize;
    }
    return changed;
}